

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_magick(CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  CImgArgumentException *this_00;
  char *pcVar6;
  char *pcVar7;
  CImgIOException *this_01;
  long in_RSI;
  uint *in_RDI;
  
  if (in_RSI == 0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    uVar1 = *in_RDI;
    uVar2 = in_RDI[1];
    uVar3 = in_RDI[2];
    uVar4 = in_RDI[3];
    uVar5 = *(undefined8 *)(in_RDI + 6);
    pcVar6 = "non-";
    if ((in_RDI[4] & 1) != 0) {
      pcVar6 = "";
    }
    pcVar7 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_magick() : Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,uVar5,pcVar6,pcVar7);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  this_01 = (CImgIOException *)__cxa_allocate_exception(0x4008);
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[2];
  uVar4 = in_RDI[3];
  uVar5 = *(undefined8 *)(in_RDI + 6);
  pcVar6 = "non-";
  if ((in_RDI[4] & 1) != 0) {
    pcVar6 = "";
  }
  pcVar7 = pixel_type();
  CImgIOException::CImgIOException
            (this_01,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_magick() : Unable to load file \'%s\' unless libMagick++ is enabled."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,uVar5,pcVar6,pcVar7,in_RSI);
  __cxa_throw(this_01,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

CImg<T>& load_magick(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_magick() : Specified filename is (null).",
                                    cimg_instance);

#ifdef cimg_use_magick
      Magick::Image image(filename);
      const unsigned int W = image.size().width(), H = image.size().height();
      switch (image.type()) {
      case Magick::PaletteMatteType :
      case Magick::TrueColorMatteType :
      case Magick::ColorSeparationType : {
        assign(W,H,1,4);
        T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
        Magick::PixelPacket *pixels = image.getPixels(0,0,W,H);
        for (unsigned int off = W*H; off; --off) {
          *(ptr_r++) = (T)(pixels->red);
          *(ptr_g++) = (T)(pixels->green);
          *(ptr_b++) = (T)(pixels->blue);
          *(ptr_a++) = (T)(pixels->opacity);
          ++pixels;
        }
      } break;
      case Magick::PaletteType :
      case Magick::TrueColorType : {
        assign(W,H,1,3);
        T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
        Magick::PixelPacket *pixels = image.getPixels(0,0,W,H);
        for (unsigned int off = W*H; off; --off) {
          *(ptr_r++) = (T)(pixels->red);
          *(ptr_g++) = (T)(pixels->green);
          *(ptr_b++) = (T)(pixels->blue);
          ++pixels;
        }
      } break;
      case Magick::GrayscaleMatteType : {
        assign(W,H,1,2);
        T *ptr_r = data(0,0,0,0), *ptr_a = data(0,0,0,1);
        Magick::PixelPacket *pixels = image.getPixels(0,0,W,H);
        for (unsigned int off = W*H; off; --off) {
          *(ptr_r++) = (T)(pixels->red);
          *(ptr_a++) = (T)(pixels->opacity);
          ++pixels;
        }
      } break;
      default : {
        assign(W,H,1,1);
        T *ptr_r = data(0,0,0,0);
        Magick::PixelPacket *pixels = image.getPixels(0,0,W,H);
        for (unsigned int off = W*H; off; --off) {
          *(ptr_r++) = (T)(pixels->red);
          ++pixels;
        }
      }
      }
#else
      throw CImgIOException(_cimg_instance
                            "load_magick() : Unable to load file '%s' unless libMagick++ is enabled.",
                            cimg_instance,
                            filename);
#endif
      return *this;
    }